

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O2

void __thiscall
Catch::Generators::Generators<std::tuple<float,float,float>>::
Generators<Catch::Generators::GeneratorWrapper<std::tuple<float,float,float>>>
          (Generators<std::tuple<float,float,float>> *this,
          GeneratorWrapper<std::tuple<float,_float,_float>_> *moreGenerators)

{
  *(Generators<std::tuple<float,float,float>> **)(this + 8) = this + 0x18;
  *(undefined8 *)(this + 0x10) = 0;
  this[0x18] = (Generators<std::tuple<float,float,float>>)0x0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined ***)this = &PTR_next_003cc770;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>_>_>
  ::reserve((vector<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>_>_>
             *)(this + 0x30),1);
  std::
  vector<Catch::Generators::GeneratorWrapper<std::tuple<float,float,float>>,std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,float,float>>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<std::tuple<float,float,float>>>
            ((vector<Catch::Generators::GeneratorWrapper<std::tuple<float,float,float>>,std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,float,float>>>>
              *)(this + 0x30),moreGenerators);
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }